

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

double units::readNumericalWords(string *ustring,size_t *index)

{
  char *pcVar1;
  double dVar2;
  undefined *puVar3;
  undefined *puVar4;
  _Alloc_hider _Var5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  size_t __n;
  size_type sVar9;
  size_type __pos;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar15;
  undefined1 auVar16 [16];
  size_t index_sub;
  string lcstring;
  undefined1 local_a8 [16];
  size_t local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [16];
  double local_38;
  
  *index = 0;
  local_a8 = ZEXT816(0x7ff4000000000000);
  auVar16 = local_a8;
  local_a8._0_8_ = NAN;
  if (2 < ustring->_M_string_length) {
    if ((hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_ == '\0')
       && (iVar6 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                        first_letters_abi_cxx11_), iVar6 != 0)) {
      hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_ =
           &DAT_004fc8b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_,
                 "otfsenhmbtzaOTFSENHMBTZA","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &hasValidNumericalWordStart(std::__cxx11::string_const&)::
                    first_letters_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                           first_letters_abi_cxx11_);
    }
    if ((hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_ == '\0')
       && (iVar6 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                        second_letters_abi_cxx11_), iVar6 != 0)) {
      hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_ =
           &DAT_004fc8e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_
                 ,"nwhoielurNWHOIELUR","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &hasValidNumericalWordStart(std::__cxx11::string_const&)::
                    second_letters_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                           second_letters_abi_cxx11_);
    }
    puVar3 = hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_;
    local_a8._0_8_ = NAN;
    if (DAT_004fc8b0 != 0) {
      pcVar1 = (ustring->_M_dataplus)._M_p;
      pvVar8 = memchr(hasValidNumericalWordStart(std::__cxx11::string_const&)::
                      first_letters_abi_cxx11_,(int)*pcVar1,DAT_004fc8b0);
      puVar4 = hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_;
      if ((((long)pvVar8 - (long)puVar3 != -1 && pvVar8 != (void *)0x0) && (_DAT_004fc8d8 != 0)) &&
         (pvVar8 = memchr(hasValidNumericalWordStart(std::__cxx11::string_const&)::
                          second_letters_abi_cxx11_,(int)pcVar1[1],_DAT_004fc8d8),
         pvVar8 != (void *)0x0 && (long)pvVar8 - (long)puVar4 != -1)) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar1,pcVar1 + ustring->_M_string_length);
        sVar9 = local_68._M_string_length;
        _Var5._M_p = local_68._M_dataplus._M_p;
        if (local_68._M_string_length != 0) {
          uVar10 = 0;
          do {
            iVar6 = tolower((int)_Var5._M_p[uVar10]);
            _Var5._M_p[uVar10] = (char)iVar6;
            uVar10 = uVar10 + 1;
          } while (sVar9 != uVar10);
        }
        bVar12 = false;
        lVar11 = 0;
        local_a8 = auVar16;
        do {
          pcVar1 = *(char **)((long)&DAT_004f1468 + lVar11);
          __n = strlen(pcVar1);
          sVar9 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                            (&local_68,pcVar1,0,__n);
          if (sVar9 != 0xffffffffffffffff) {
            if (sVar9 == 0) {
              local_90 = 0;
              local_a8._0_8_ = *(double *)((long)&DAT_004f1460 + lVar11);
              local_a8._8_8_ = 0;
              __pos = (size_type)*(int *)((long)&groupNumericalWords + lVar11);
              *index = __pos;
              if (__pos < local_68._M_string_length) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::substr(&local_88,&local_68,__pos,0xffffffffffffffff);
                dVar2 = readNumericalWords((string *)&local_88,&local_90);
                uVar13 = SUB84(dVar2,0);
                uVar14 = (undefined4)((ulong)dVar2 >> 0x20);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  local_48._0_8_ = dVar2;
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                  uVar13 = local_48._0_4_;
                  uVar14 = local_48._4_4_;
                }
                if (!NAN((double)CONCAT44(uVar14,uVar13)) && !NAN((double)CONCAT44(uVar14,uVar13)))
                {
                  uVar10 = -(ulong)((double)CONCAT44(uVar14,uVar13) < (double)local_a8._0_8_);
                  local_a8._8_8_ = 0;
                  local_a8._0_8_ =
                       ~uVar10 & (ulong)((double)local_a8._0_8_ * (double)CONCAT44(uVar14,uVar13)) |
                       (ulong)((double)local_a8._0_8_ + (double)CONCAT44(uVar14,uVar13)) & uVar10;
                  *index = *index + local_90;
                }
              }
            }
            else {
              local_90 = 0;
              local_48._8_8_ = 0;
              local_48._0_8_ = *(ulong *)((long)&DAT_004f1460 + lVar11);
              uVar10 = (long)*(int *)((long)&groupNumericalWords + lVar11) + sVar9;
              *index = uVar10;
              local_38 = 0.0;
              if (uVar10 < local_68._M_string_length) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::substr(&local_88,&local_68,uVar10,0xffffffffffffffff);
                dVar2 = readNumericalWords((string *)&local_88,&local_90);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
                if (!NAN(dVar2)) {
                  dVar15 = (double)local_48._0_8_;
                  if ((double)local_48._0_8_ <= dVar2) {
                    dVar15 = (double)local_48._0_8_ * dVar2;
                  }
                  auVar16._8_8_ = local_48._8_8_;
                  auVar16._0_8_ = dVar15;
                  *index = *index + local_90;
                  local_38 = (double)(-(ulong)(dVar2 < (double)local_48._0_8_) & (ulong)dVar2);
                  local_48 = auVar16;
                }
              }
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_88,&local_68,0,sVar9);
              dVar2 = readNumericalWords((string *)&local_88,&local_90);
              local_a8._8_4_ = extraout_XMM0_Dc;
              local_a8._0_8_ = dVar2;
              local_a8._12_4_ = extraout_XMM0_Dd;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              if ((NAN(dVar2)) || (local_90 < sVar9)) {
                *index = local_90;
              }
              else {
                local_a8._8_8_ = 0;
                local_a8._0_8_ = local_38 + (double)local_48._0_8_ * dVar2;
              }
            }
          }
          if (sVar9 != 0xffffffffffffffff) break;
          lVar11 = lVar11 + 0x18;
          bVar12 = lVar11 == 0x90;
        } while (!bVar12);
        if (bVar12) {
          iVar6 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            (&local_68,0,3,"and");
          if (iVar6 == 0) {
            *index = *index + 3;
          }
          lVar11 = 0x10;
          bVar12 = false;
          do {
            iVar6 = *(int *)(&UNK_004f14d8 + lVar11);
            iVar7 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                              (&local_68,*index,(long)iVar6,*(char **)((long)&decadeWords + lVar11))
            ;
            if (iVar7 == 0) {
              uVar10 = (long)iVar6 + *index;
              local_a8._0_8_ = *(undefined8 *)(&UNK_004f14e0 + lVar11);
              local_a8._8_8_ = 0;
              *index = uVar10;
              if (uVar10 < local_68._M_string_length) {
                if (local_68._M_dataplus._M_p[uVar10] == '-') {
                  *index = uVar10 + 1;
                }
                dVar2 = read1To10((string *)&local_68,index);
                local_a8._8_8_ = 0;
                local_a8._0_8_ =
                     local_a8._0_8_ & -(ulong)NAN(dVar2) |
                     ~-(ulong)NAN(dVar2) & (ulong)((double)local_a8._0_8_ + dVar2);
              }
            }
            if (iVar7 == 0) break;
            lVar11 = lVar11 + 0x18;
            bVar12 = lVar11 == 0xd0;
          } while (!bVar12);
          if (bVar12) {
            lVar11 = 0x10;
            do {
              iVar6 = *(int *)(&UNK_004f1670 + lVar11);
              iVar7 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_68,*index,(long)iVar6,*(char **)((long)&teens + lVar11));
              if (iVar7 == 0) {
                *index = *index + (long)iVar6;
                local_a8._0_4_ = (undefined4)*(undefined8 *)(&UNK_004f1678 + lVar11);
                local_a8._4_4_ =
                     (undefined4)((ulong)*(undefined8 *)(&UNK_004f1678 + lVar11) >> 0x20);
                goto LAB_003acc65;
              }
              lVar11 = lVar11 + 0x18;
            } while (lVar11 != 0x118);
            local_a8._0_4_ = 0;
            local_a8._4_4_ = 0x7ff40000;
LAB_003acc65:
            if (NAN((double)CONCAT44(local_a8._4_4_,local_a8._0_4_)) ||
                NAN((double)CONCAT44(local_a8._4_4_,local_a8._0_4_))) {
              local_a8._0_8_ = read1To10((string *)&local_68,index);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return (double)local_a8._0_8_;
}

Assistant:

static double readNumericalWords(const std::string& ustring, size_t& index)
{
    double val = constants::invalid_conversion;
    index = 0;
    if (ustring.size() < 3) {
        return val;
    }
    if (!hasValidNumericalWordStart(ustring)) {
        return val;
    }
    std::string lcstring{ustring};
    // make the string lower case for consistency
    std::transform(
        lcstring.begin(), lcstring.end(), lcstring.begin(), ::tolower);
    for (const auto& wp : groupNumericalWords) {
        auto loc = lcstring.find(std::get<0>(wp));
        if (loc != std::string::npos) {
            if (loc == 0) {
                size_t index_sub{0};
                val = std::get<1>(wp);
                index = std::get<2>(wp);
                if (index < lcstring.size()) {
                    double val_p2 =
                        readNumericalWords(lcstring.substr(index), index_sub);
                    if (!std::isnan(val_p2)) {
                        if (val_p2 >= val) {
                            val = val * val_p2;
                        } else {
                            val += val_p2;
                        }

                        index += index_sub;
                    }
                }
                return val;
            }
            size_t index_sub{0};
            val = std::get<1>(wp);
            index = loc + std::get<2>(wp);
            // read the next component
            double val_add{0.0};
            if (index < lcstring.size()) {
                val_add = readNumericalWords(lcstring.substr(index), index_sub);
                if (!std::isnan(val_add)) {
                    if (val_add >= val) {
                        val = val * val_add;
                        val_add = 0.0;
                    }
                    index += index_sub;
                } else {
                    val_add = 0.0;
                }
            }
            // read the previous part
            double val_p2 =
                readNumericalWords(lcstring.substr(0, loc), index_sub);
            if (std::isnan(val_p2) || index_sub < loc) {
                index = index_sub;
                return val_p2;
            }
            val *= val_p2;
            val += val_add;
            return val;
        }
    }
    // clean up "and"
    if (lcstring.compare(0, 3, "and") == 0) {
        index += 3;
    }
    // what we are left with is values below a hundred
    for (const auto& wp : decadeWords) {
        if (lcstring.compare(index, std::get<2>(wp), std::get<0>(wp)) == 0) {
            val = std::get<1>(wp);
            index += std::get<2>(wp);
            if (lcstring.size() > index) {
                if (lcstring[index] == '-') {
                    ++index;
                }
                double toTen = read1To10(lcstring, index);
                if (!std::isnan(toTen)) {
                    val += toTen;
                }
            }
            return val;
        }
    }
    val = readTeens(lcstring, index);
    if (!std::isnan(val)) {
        return val;
    }
    val = read1To10(lcstring, index);
    return val;
}